

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformation::GetMemoryDescription_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this,char *hostLimitEnvVarName,
          char *procLimitEnvVarName)

{
  ostream *poVar1;
  longlong lVar2;
  ostringstream local_1a0 [8];
  ostringstream oss;
  char *procLimitEnvVarName_local;
  char *hostLimitEnvVarName_local;
  SystemInformation *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"Host Total: ");
  lVar2 = GetHostMemoryTotal(this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,lVar2);
  poVar1 = std::operator<<(poVar1," KiB, Host Available: ");
  lVar2 = GetHostMemoryAvailable(this,hostLimitEnvVarName);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,lVar2);
  poVar1 = std::operator<<(poVar1," KiB, Process Available: ");
  lVar2 = GetProcMemoryAvailable(this,hostLimitEnvVarName,procLimitEnvVarName);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,lVar2);
  std::operator<<(poVar1," KiB");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformation::GetMemoryDescription(
  const char* hostLimitEnvVarName, const char* procLimitEnvVarName)
{
  std::ostringstream oss;
  oss << "Host Total: " << this->GetHostMemoryTotal()
      << " KiB, Host Available: "
      << this->GetHostMemoryAvailable(hostLimitEnvVarName)
      << " KiB, Process Available: "
      << this->GetProcMemoryAvailable(hostLimitEnvVarName, procLimitEnvVarName)
      << " KiB";
  return oss.str();
}